

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

char * TextToUtf8(int *codepoints,int length)

{
  int iVar1;
  uint in_EAX;
  char *__ptr;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uStack_38;
  int bytes;
  
  uStack_38 = in_EAX;
  __ptr = (char *)calloc((long)(length * 5),1);
  _uStack_38 = (ulong)uStack_38;
  uVar4 = 0;
  uVar3 = (ulong)(uint)length;
  if (length < 1) {
    uVar3 = uVar4;
  }
  iVar5 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    CodepointToUtf8(codepoints[uVar4],&bytes);
    iVar1 = bytes;
    memcpy(__ptr + iVar5,CodepointToUtf8::utf8,(long)bytes);
    iVar5 = iVar5 + iVar1;
  }
  pcVar2 = (char *)realloc(__ptr,(long)(iVar5 + 1));
  if (pcVar2 == (char *)0x0) {
    pcVar2 = __ptr;
  }
  return pcVar2;
}

Assistant:

char *TextToUtf8(int *codepoints, int length)
{
    // We allocate enough memory fo fit all possible codepoints
    // NOTE: 5 bytes for every codepoint should be enough
    char *text = (char *)RL_CALLOC(length*5, 1);
    const char *utf8 = NULL;
    int size = 0;

    for (int i = 0, bytes = 0; i < length; i++)
    {
        utf8 = CodepointToUtf8(codepoints[i], &bytes);
        memcpy(text + size, utf8, bytes);
        size += bytes;
    }

    // Resize memory to text length + string NULL terminator
    void *ptr = RL_REALLOC(text, size + 1);

    if (ptr != NULL) text = (char *)ptr;

    return text;
}